

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

integer pow_ii(integer *ap,integer *bp)

{
  integer local_3c;
  ulong local_38;
  unsigned_long u;
  int local_28;
  integer n;
  integer x;
  integer pow;
  integer *bp_local;
  integer *ap_local;
  
  local_28 = *ap;
  u._4_4_ = *bp;
  if (u._4_4_ < 1) {
    if ((u._4_4_ == 0) || (local_28 == 1)) {
      return 1;
    }
    if (local_28 != -1) {
      if (local_28 == 0) {
        local_3c = 0;
      }
      else {
        local_3c = (integer)(1 / (long)local_28);
      }
      return local_3c;
    }
    u._4_4_ = -u._4_4_;
  }
  local_38 = (ulong)u._4_4_;
  n = 1;
  while( true ) {
    if ((local_38 & 1) != 0) {
      n = local_28 * n;
    }
    local_38 = local_38 >> 1;
    if (local_38 == 0) break;
    local_28 = local_28 * local_28;
  }
  return n;
}

Assistant:

integer pow_ii(ap, bp) integer *ap, *bp;
#else
    integer pow_ii(integer * ap, integer * bp)
#endif
    {
        integer pow, x, n;
        unsigned long u;

         x = *ap;
         n = *bp;

        if (n <= 0) {
            if (n == 0 || x == 1)
                return 1;
            if (x != -1)
                return x != 0 ? 1 / x : 0;
            n = -n;
        }